

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlCtxtReset(htmlParserCtxtPtr ctxt)

{
  xmlDictPtr dict_00;
  int iVar1;
  xmlParserInputPtr input_00;
  xmlDictPtr dict;
  xmlParserInputPtr input;
  htmlParserCtxtPtr ctxt_local;
  
  if (ctxt != (htmlParserCtxtPtr)0x0) {
    xmlInitParser();
    dict_00 = ctxt->dict;
    while (input_00 = inputPop(ctxt), input_00 != (xmlParserInputPtr)0x0) {
      xmlFreeInputStream(input_00);
    }
    ctxt->inputNr = 0;
    ctxt->input = (xmlParserInputPtr)0x0;
    ctxt->spaceNr = 0;
    if (ctxt->spaceTab == (int *)0x0) {
      ctxt->space = (int *)0x0;
    }
    else {
      *ctxt->spaceTab = -1;
      ctxt->space = ctxt->spaceTab;
    }
    ctxt->nodeNr = 0;
    ctxt->node = (xmlNodePtr)0x0;
    ctxt->nameNr = 0;
    ctxt->name = (xmlChar *)0x0;
    ctxt->nsNr = 0;
    if ((ctxt->version != (xmlChar *)0x0) &&
       ((dict_00 == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(dict_00,ctxt->version), iVar1 == 0)))) {
      (*xmlFree)(ctxt->version);
    }
    ctxt->version = (xmlChar *)0x0;
    if ((ctxt->encoding != (xmlChar *)0x0) &&
       ((dict_00 == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(dict_00,ctxt->encoding), iVar1 == 0))))
    {
      (*xmlFree)(ctxt->encoding);
    }
    ctxt->encoding = (xmlChar *)0x0;
    if ((ctxt->directory != (char *)0x0) &&
       ((dict_00 == (xmlDictPtr)0x0 ||
        (iVar1 = xmlDictOwns(dict_00,(xmlChar *)ctxt->directory), iVar1 == 0)))) {
      (*xmlFree)(ctxt->directory);
    }
    ctxt->directory = (char *)0x0;
    if ((ctxt->extSubURI != (xmlChar *)0x0) &&
       ((dict_00 == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(dict_00,ctxt->extSubURI), iVar1 == 0))))
    {
      (*xmlFree)(ctxt->extSubURI);
    }
    ctxt->extSubURI = (xmlChar *)0x0;
    if ((ctxt->extSubSystem != (xmlChar *)0x0) &&
       ((dict_00 == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(dict_00,ctxt->extSubSystem), iVar1 == 0)
        ))) {
      (*xmlFree)(ctxt->extSubSystem);
    }
    ctxt->extSubSystem = (xmlChar *)0x0;
    if (ctxt->myDoc != (xmlDocPtr)0x0) {
      xmlFreeDoc(ctxt->myDoc);
    }
    ctxt->myDoc = (xmlDocPtr)0x0;
    ctxt->standalone = -1;
    ctxt->hasExternalSubset = 0;
    ctxt->hasPErefs = 0;
    ctxt->html = 1;
    ctxt->external = 0;
    ctxt->instate = XML_PARSER_START;
    ctxt->token = 0;
    ctxt->wellFormed = 1;
    ctxt->nsWellFormed = 1;
    ctxt->disableSAX = 0;
    ctxt->valid = 1;
    (ctxt->vctxt).userData = ctxt;
    (ctxt->vctxt).error = xmlParserValidityError;
    (ctxt->vctxt).warning = xmlParserValidityWarning;
    ctxt->record_info = 0;
    ctxt->checkIndex = 0;
    ctxt->inSubset = 0;
    ctxt->errNo = 0;
    ctxt->depth = 0;
    ctxt->charset = 0;
    ctxt->catalogs = (void *)0x0;
    xmlInitNodeInfoSeq(&ctxt->node_seq);
    if (ctxt->attsDefault != (xmlHashTablePtr)0x0) {
      xmlHashFree(ctxt->attsDefault,xmlHashDefaultDeallocator);
      ctxt->attsDefault = (xmlHashTablePtr)0x0;
    }
    if (ctxt->attsSpecial != (xmlHashTablePtr)0x0) {
      xmlHashFree(ctxt->attsSpecial,(xmlHashDeallocator)0x0);
      ctxt->attsSpecial = (xmlHashTablePtr)0x0;
    }
  }
  return;
}

Assistant:

void
htmlCtxtReset(htmlParserCtxtPtr ctxt)
{
    xmlParserInputPtr input;
    xmlDictPtr dict;

    if (ctxt == NULL)
        return;

    xmlInitParser();
    dict = ctxt->dict;

    while ((input = inputPop(ctxt)) != NULL) { /* Non consuming */
        xmlFreeInputStream(input);
    }
    ctxt->inputNr = 0;
    ctxt->input = NULL;

    ctxt->spaceNr = 0;
    if (ctxt->spaceTab != NULL) {
	ctxt->spaceTab[0] = -1;
	ctxt->space = &ctxt->spaceTab[0];
    } else {
	ctxt->space = NULL;
    }


    ctxt->nodeNr = 0;
    ctxt->node = NULL;

    ctxt->nameNr = 0;
    ctxt->name = NULL;

    ctxt->nsNr = 0;

    DICT_FREE(ctxt->version);
    ctxt->version = NULL;
    DICT_FREE(ctxt->encoding);
    ctxt->encoding = NULL;
    DICT_FREE(ctxt->directory);
    ctxt->directory = NULL;
    DICT_FREE(ctxt->extSubURI);
    ctxt->extSubURI = NULL;
    DICT_FREE(ctxt->extSubSystem);
    ctxt->extSubSystem = NULL;
    if (ctxt->myDoc != NULL)
        xmlFreeDoc(ctxt->myDoc);
    ctxt->myDoc = NULL;

    ctxt->standalone = -1;
    ctxt->hasExternalSubset = 0;
    ctxt->hasPErefs = 0;
    ctxt->html = 1;
    ctxt->external = 0;
    ctxt->instate = XML_PARSER_START;
    ctxt->token = 0;

    ctxt->wellFormed = 1;
    ctxt->nsWellFormed = 1;
    ctxt->disableSAX = 0;
    ctxt->valid = 1;
    ctxt->vctxt.userData = ctxt;
    ctxt->vctxt.error = xmlParserValidityError;
    ctxt->vctxt.warning = xmlParserValidityWarning;
    ctxt->record_info = 0;
    ctxt->checkIndex = 0;
    ctxt->inSubset = 0;
    ctxt->errNo = XML_ERR_OK;
    ctxt->depth = 0;
    ctxt->charset = XML_CHAR_ENCODING_NONE;
    ctxt->catalogs = NULL;
    xmlInitNodeInfoSeq(&ctxt->node_seq);

    if (ctxt->attsDefault != NULL) {
        xmlHashFree(ctxt->attsDefault, xmlHashDefaultDeallocator);
        ctxt->attsDefault = NULL;
    }
    if (ctxt->attsSpecial != NULL) {
        xmlHashFree(ctxt->attsSpecial, NULL);
        ctxt->attsSpecial = NULL;
    }
}